

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

void __thiscall DomLayoutItem::~DomLayoutItem(DomLayoutItem *this)

{
  DomWidget *this_00;
  DomLayout *this_01;
  DomSpacer *this_02;
  Data *pDVar1;
  
  this_00 = this->m_widget;
  if (this_00 != (DomWidget *)0x0) {
    DomWidget::~DomWidget(this_00);
    operator_delete(this_00,0x160);
  }
  this_01 = this->m_layout;
  if (this_01 != (DomLayout *)0x0) {
    DomLayout::~DomLayout(this_01);
    operator_delete(this_01,0x128);
  }
  this_02 = this->m_spacer;
  if (this_02 != (DomSpacer *)0x0) {
    DomSpacer::~DomSpacer(this_02);
    operator_delete(this_02,0x38);
  }
  pDVar1 = (this->m_attr_alignment).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_alignment).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

DomLayoutItem::~DomLayoutItem()
{
    delete m_widget;
    delete m_layout;
    delete m_spacer;
}